

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O1

MXFReader * __thiscall AS_02::IAB::MXFReader::OpenRead(MXFReader *this,string *filename)

{
  size_type sVar1;
  ILogSink *pIVar2;
  string *filename_00;
  Dictionary *d;
  RuntimeError *this_00;
  InterchangeObject *tmp_iobj;
  RuntimeError e;
  Result_t result;
  undefined1 local_248 [120];
  int local_1d0;
  Result_t local_98 [104];
  
  if ((filename->_M_string_length != 0) && (*(int *)(filename->_M_string_length + 0x500) != 0)) {
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar2,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_IAB.cpp"
               ,0x19d);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
    return this;
  }
  Kumu::Result_t::Result_t((Result_t *)&local_1d0,(Result_t *)&Kumu::RESULT_OK);
  filename_00 = (string *)operator_new(0x508);
  d = (Dictionary *)ASDCP::DefaultCompositeDict();
  h__AS02Reader::h__AS02Reader
            ((h__AS02Reader *)filename_00,d,*(IFileReaderFactory **)((long)&filename[1].field_2 + 8)
            );
  (filename_00->_M_dataplus)._M_p = (pointer)&PTR__h__AS02Reader_0016daf8;
  *(undefined4 *)&filename_00[0x28]._M_dataplus._M_p = 0;
  if ((long *)filename->_M_string_length != (long *)0x0) {
    (**(code **)(*(long *)filename->_M_string_length + 8))();
  }
  filename->_M_string_length = (size_type)filename_00;
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)local_248,filename_00);
  Kumu::Result_t::operator=((Result_t *)&local_1d0,(Result_t *)local_248);
  Kumu::Result_t::~Result_t((Result_t *)local_248);
  if (-1 < local_1d0) {
    sVar1 = filename->_M_string_length;
    ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(sVar1 + 8));
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              ((uchar *)local_98,(InterchangeObject **)(sVar1 + 0x18));
    Kumu::Result_t::~Result_t(local_98);
  }
  pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
  Kumu::ILogSink::Error(pIVar2,"IABEssenceDescriptor object not found in IMF/IAB MXF file.\n");
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x78);
  Kumu::RuntimeError::RuntimeError(this_00,(Result_t *)Kumu::RESULT_FAIL);
  __cxa_throw(this_00,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
}

Assistant:

Result_t
AS_02::IAB::MXFReader::OpenRead(const std::string& filename) {

  /* are we already running */

  if ( this->m_Reader && this->m_Reader->m_State != ST_READER_BEGIN ) {
    KM_RESULT_STATE_HERE();
    return Kumu::RESULT_STATE;
  }

  Result_t result = Kumu::RESULT_OK;

  /* initialize the writer */

  this->m_Reader = new h__Reader(&DefaultCompositeDict(), m_FileReaderFactory);

  try {

    result = this->m_Reader->OpenMXFRead(filename);

    InterchangeObject* tmp_iobj = 0;

    if ( ASDCP_SUCCESS(result)){
      this->m_Reader->m_HeaderPart.GetMDObjectByType(
        this->m_Reader->m_Dict->Type(MDD_IABEssenceDescriptor).ul,
        &tmp_iobj
    );
    }

    if (!tmp_iobj) {
      DefaultLogSink().Error("IABEssenceDescriptor object not found in IMF/IAB MXF file.\n");
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    this->m_Reader->m_HeaderPart.GetMDObjectByType(
      this->m_Reader->m_Dict->Type(MDD_IABSoundfieldLabelSubDescriptor).ul,
      &tmp_iobj
    );

    if (!tmp_iobj) {
      DefaultLogSink().Error("IABSoundfieldLabelSubDescriptor object not found.\n");
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    std::list<InterchangeObject*> ObjectList;

    this->m_Reader->m_HeaderPart.GetMDObjectsByType(
      this->m_Reader->m_Dict->Type(MDD_Track).ul,
      ObjectList
    );

    if (ObjectList.empty()) {
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    /* invalidate current frame */

    /* we are ready */

    this->m_Reader->m_State = ST_READER_READY;

  } catch (Kumu::RuntimeError e) {

    this->Reset();

    return e.GetResult();
  }

  return RESULT_OK;
}